

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_blocks.cpp
# Opt level: O2

int libtorrent::aux::source_rank(peer_source_flags_t source_bitmask)

{
  return (int)(byte)(source_bitmask.m_val & 4 | source_bitmask.m_val * '\x02' & 0x10 |
                     (source_bitmask.m_val & 1) << 5 | source_bitmask.m_val * '\x04' & 8);
}

Assistant:

int source_rank(peer_source_flags_t const source_bitmask)
	{
		int ret = 0;
		if (source_bitmask & peer_info::tracker) ret |= 1 << 5;
		if (source_bitmask & peer_info::lsd) ret |= 1 << 4;
		if (source_bitmask & peer_info::dht) ret |= 1 << 3;
		if (source_bitmask & peer_info::pex) ret |= 1 << 2;
		return ret;
	}